

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

void __thiscall
mocker::anon_unknown_6::FindPureFunctions::operator()(FindPureFunctions *this,ForStmt *node)

{
  bool bVar1;
  shared_ptr<mocker::ast::ASTNode> local_68;
  shared_ptr<mocker::ast::ASTNode> local_58;
  shared_ptr<mocker::ast::ASTNode> local_48 [2];
  shared_ptr<mocker::ast::ASTNode> local_28;
  ForStmt *local_18;
  ForStmt *node_local;
  FindPureFunctions *this_local;
  
  local_18 = node;
  node_local = (ForStmt *)this;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&node->init);
  if (bVar1) {
    std::shared_ptr<mocker::ast::ASTNode>::shared_ptr<mocker::ast::Expression,void>
              (&local_28,&local_18->init);
    visit(this,&local_28);
    std::shared_ptr<mocker::ast::ASTNode>::~shared_ptr(&local_28);
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_18->condition);
  if (bVar1) {
    std::shared_ptr<mocker::ast::ASTNode>::shared_ptr<mocker::ast::Expression,void>
              (local_48,&local_18->condition);
    visit(this,local_48);
    std::shared_ptr<mocker::ast::ASTNode>::~shared_ptr(local_48);
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_18->update);
  if (bVar1) {
    std::shared_ptr<mocker::ast::ASTNode>::shared_ptr<mocker::ast::Expression,void>
              (&local_58,&local_18->update);
    visit(this,&local_58);
    std::shared_ptr<mocker::ast::ASTNode>::~shared_ptr(&local_58);
  }
  std::shared_ptr<mocker::ast::ASTNode>::shared_ptr<mocker::ast::Statement,void>
            (&local_68,&local_18->body);
  visit(this,&local_68);
  std::shared_ptr<mocker::ast::ASTNode>::~shared_ptr(&local_68);
  return;
}

Assistant:

void operator()(const ast::ForStmt &node) const override {
    if (node.init)
      visit(node.init);
    if (node.condition)
      visit(node.condition);
    if (node.update)
      visit(node.update);
    visit(node.body);
  }